

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  ulong uVar1;
  ZSTD_allocFunction p_Var2;
  ZSTD_freeFunction p_Var3;
  void *pvVar4;
  ZSTD_DDict **__ptr;
  ZSTD_DDict **ppZVar5;
  ZSTD_DDictHashSet *hashSet;
  size_t sVar6;
  size_t sVar7;
  size_t __size;
  size_t sVar8;
  
  if (dctx->streamStage != zdss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict == (ZSTD_DDict *)0x0) {
    return 0;
  }
  dctx->ddict = ddict;
  dctx->dictUses = ZSTD_use_indefinitely;
  if (dctx->refMultipleDDicts != ZSTD_rmd_refMultipleDDicts) {
    return 0;
  }
  hashSet = dctx->ddictSet;
  if (hashSet == (ZSTD_DDictHashSet *)0x0) {
    p_Var2 = (dctx->customMem).customAlloc;
    pvVar4 = (dctx->customMem).opaque;
    if (p_Var2 == (ZSTD_allocFunction)0x0) {
      p_Var3 = (dctx->customMem).customFree;
      hashSet = (ZSTD_DDictHashSet *)malloc(0x18);
      if (hashSet == (ZSTD_DDictHashSet *)0x0) {
LAB_0038945d:
        dctx->ddictSet = (ZSTD_DDictHashSet *)0x0;
        return 0xffffffffffffffc0;
      }
      ppZVar5 = (ZSTD_DDict **)calloc(1,0x200);
      hashSet->ddictPtrTable = ppZVar5;
      if (ppZVar5 == (ZSTD_DDict **)0x0) {
        if (p_Var3 == (ZSTD_freeFunction)0x0) {
          free(hashSet);
        }
        else {
          (*p_Var3)(pvVar4,hashSet);
        }
        goto LAB_0038945d;
      }
    }
    else {
      hashSet = (ZSTD_DDictHashSet *)(*p_Var2)(pvVar4,0x18);
      if (hashSet == (ZSTD_DDictHashSet *)0x0) goto LAB_0038945d;
      ppZVar5 = (ZSTD_DDict **)(*p_Var2)(pvVar4,0x200);
      memset(ppZVar5,0,0x200);
      hashSet->ddictPtrTable = ppZVar5;
    }
    hashSet->ddictPtrTableSize = 0x40;
    hashSet->ddictPtrCount = 0;
    dctx->ddictSet = hashSet;
  }
  else {
    uVar1 = hashSet->ddictPtrTableSize;
    if (uVar1 <= hashSet->ddictPtrCount << 2) {
      p_Var2 = (dctx->customMem).customAlloc;
      p_Var3 = (dctx->customMem).customFree;
      pvVar4 = (dctx->customMem).opaque;
      __size = uVar1 << 4;
      if (p_Var2 == (ZSTD_allocFunction)0x0) {
        ppZVar5 = (ZSTD_DDict **)calloc(1,__size);
        sVar7 = uVar1;
      }
      else {
        ppZVar5 = (ZSTD_DDict **)(*p_Var2)(pvVar4,__size);
        memset(ppZVar5,0,__size);
        sVar7 = hashSet->ddictPtrTableSize;
      }
      if (ppZVar5 == (ZSTD_DDict **)0x0) {
        return 0xffffffffffffffc0;
      }
      __ptr = hashSet->ddictPtrTable;
      hashSet->ddictPtrTable = ppZVar5;
      hashSet->ddictPtrTableSize = uVar1 * 2;
      hashSet->ddictPtrCount = 0;
      if (sVar7 == 0) {
        if (__ptr == (ZSTD_DDict **)0x0) goto LAB_00389423;
      }
      else {
        sVar8 = 0;
        do {
          if ((__ptr[sVar8] != (ZSTD_DDict *)0x0) &&
             (sVar6 = ZSTD_DDictHashSet_emplaceDDict(hashSet,__ptr[sVar8]),
             0xffffffffffffff88 < sVar6)) {
            return 0xffffffffffffffff;
          }
          sVar8 = sVar8 + 1;
        } while (sVar7 != sVar8);
      }
      if (p_Var3 == (ZSTD_freeFunction)0x0) {
        free(__ptr);
      }
      else {
        (*p_Var3)(pvVar4,__ptr);
      }
    }
  }
LAB_00389423:
  sVar7 = ZSTD_DDictHashSet_emplaceDDict(hashSet,ddict);
  if (sVar7 < 0xffffffffffffff89) {
    return 0;
  }
  return sVar7;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}